

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O1

void __thiscall xercesc_4_0::QName::QName(QName *this,QName *qname)

{
  short *psVar1;
  MemoryManager *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__QName_0040b5c0;
  this->fPrefixBufSz = 0;
  this->fLocalPartBufSz = 0;
  *(undefined8 *)((long)&this->fLocalPartBufSz + 4) = 0;
  *(undefined8 *)((long)&this->fRawNameBufSz + 4) = 0;
  this->fPrefix = (XMLCh *)0x0;
  this->fLocalPart = (XMLCh *)0x0;
  this->fRawName = (XMLCh *)0x0;
  pMVar2 = qname->fMemoryManager;
  this->fMemoryManager = pMVar2;
  lVar4 = 0;
  if (qname->fLocalPart != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)qname->fLocalPart + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    lVar4 = (lVar4 >> 1) + -1;
  }
  this->fLocalPartBufSz = lVar4 + 8;
  iVar3 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,lVar4 * 2 + 0x12);
  this->fLocalPart = (XMLCh *)CONCAT44(extraout_var,iVar3);
  memmove((XMLCh *)CONCAT44(extraout_var,iVar3),qname->fLocalPart,lVar4 * 2 + 2);
  lVar4 = 0;
  if (qname->fPrefix != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)qname->fPrefix + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    lVar4 = (lVar4 >> 1) + -1;
  }
  this->fPrefixBufSz = lVar4 + 8;
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar4 * 2 + 0x12);
  this->fPrefix = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
  memmove((XMLCh *)CONCAT44(extraout_var_00,iVar3),qname->fPrefix,lVar4 * 2 + 2);
  this->fURIId = qname->fURIId;
  return;
}

Assistant:

QName::QName(const QName& qname)
:XSerializable(qname)
,XMemory(qname)
,fPrefixBufSz(0)
,fLocalPartBufSz(0)
,fRawNameBufSz(0)
,fURIId(0)
,fPrefix(0)
,fLocalPart(0)
,fRawName(0)
,fMemoryManager(qname.fMemoryManager)
{
    XMLSize_t newLen;

    newLen = XMLString::stringLen(qname.getLocalPart());
    fLocalPartBufSz = newLen + 8;
    fLocalPart = (XMLCh*) fMemoryManager->allocate
    (
        (fLocalPartBufSz + 1) * sizeof(XMLCh)
    ); //new XMLCh[fLocalPartBufSz + 1];
    XMLString::moveChars(fLocalPart, qname.getLocalPart(), newLen + 1);

    newLen = XMLString::stringLen(qname.getPrefix());
    fPrefixBufSz = newLen + 8;
    fPrefix = (XMLCh*) fMemoryManager->allocate
    (
        (fPrefixBufSz + 1) * sizeof(XMLCh)
    ); //new XMLCh[fPrefixBufSz + 1];
    XMLString::moveChars(fPrefix, qname.getPrefix(), newLen + 1);

    fURIId = qname.getURI();
}